

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_ManSolve(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int local_1c;
  int RetValue;
  Gia_Obj_t *pObj_local;
  Cbs0_Man_t *p_local;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x289,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    (p->Pars).nJustThis = 0;
    (p->Pars).nBTThis = 0;
    Cbs0_ManAssign(p,pObj);
    local_1c = Cbs0_ManSolve_rec(p);
    if (local_1c == 0) {
      iVar1 = Cbs0_ManCheckLimits(p);
      if (iVar1 == 0) {
        Cbs0_ManSaveModel(p,p->vModel);
      }
    }
    Cbs0_ManCancelUntil(p,0);
    (p->pJust).iTail = 0;
    (p->pJust).iHead = 0;
    (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
    iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
    (p->Pars).nJustTotal = iVar1;
    iVar1 = Cbs0_ManCheckLimits(p);
    if (iVar1 != 0) {
      local_1c = -1;
    }
    return local_1c;
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                ,0x28a,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs0_ManSolve( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    p->Pars.nBTThis = p->Pars.nJustThis = 0;
    Cbs0_ManAssign( p, pObj );
    RetValue = Cbs0_ManSolve_rec( p );
    if ( RetValue == 0 && !Cbs0_ManCheckLimits(p) )
        Cbs0_ManSaveModel( p, p->vModel );
    Cbs0_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs0_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "Outcome = %2d.  Confs = %6d.  Decision level max = %3d.\n", 
//        RetValue, p->Pars.nBTThis, p->DecLevelMax );
    return RetValue;
}